

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-http.c
# Opt level: O3

int lws_client_http_multipart
              (lws *wsi,char *name,char *filename,char *content_type,char **p,char *end)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  size_t size;
  int iVar4;
  uint uVar5;
  
  if (((wsi->http).field_0x88 & 8) != 0) {
    iVar4 = (int)end;
    iVar1 = (int)p;
    if (name == (char *)0x0) {
      uVar5 = 0;
      iVar1 = lws_snprintf(*p,(long)(iVar4 - iVar1),"\r\n--%s--\r\n",(wsi->http).multipart_boundary)
      ;
      *p = *p + iVar1;
    }
    else {
      uVar2 = *(ulong *)&wsi->field_0x2dc;
      if ((uVar2 >> 0x39 & 1) == 0) {
        size = (size_t)(iVar4 - iVar1);
      }
      else {
        size = (size_t)(iVar4 - iVar1);
        iVar1 = lws_snprintf(*p,size,"\r\n");
        *p = *p + iVar1;
        uVar2 = *(ulong *)&wsi->field_0x2dc;
      }
      *(ulong *)&wsi->field_0x2dc = uVar2 | 0x200000000000000;
      iVar1 = lws_snprintf(*p,size,"--%s\r\nContent-Disposition: form-data; name=\"%s\"",
                           (wsi->http).multipart_boundary,name);
      pcVar3 = *p + iVar1;
      *p = pcVar3;
      if (filename != (char *)0x0) {
        iVar1 = lws_snprintf(pcVar3,size,"; filename=\"%s\"",filename);
        pcVar3 = *p + iVar1;
        *p = pcVar3;
      }
      if (content_type != (char *)0x0) {
        iVar1 = lws_snprintf(pcVar3,size,"\r\nContent-Type: %s");
        pcVar3 = *p + iVar1;
        *p = pcVar3;
      }
      iVar1 = lws_snprintf(pcVar3,size,"\r\n\r\n");
      pcVar3 = *p;
      *p = pcVar3 + iVar1;
      uVar5 = (uint)(pcVar3 + iVar1 == end);
    }
    return uVar5;
  }
  __assert_fail("wsi->http.multipart",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/http/client/client-http.c"
                ,0x3a7,
                "int lws_client_http_multipart(struct lws *, const char *, const char *, const char *, char **, char *)"
               );
}

Assistant:

int
lws_client_http_multipart(struct lws *wsi, const char *name,
			  const char *filename, const char *content_type,
			  char **p, char *end)
{
	/*
	 * Client conn must have been created with LCCSCF_HTTP_MULTIPART_MIME
	 * flag to use this api
	 */
	assert(wsi->http.multipart);

	if (!name) {
		*p += lws_snprintf((char *)(*p), lws_ptr_diff(end, p),
					"\xd\xa--%s--\xd\xa",
					wsi->http.multipart_boundary);

		return 0;
	}

	if (wsi->client_subsequent_mime_part)
		*p += lws_snprintf((char *)(*p), lws_ptr_diff(end, p), "\xd\xa");
	wsi->client_subsequent_mime_part = 1;

	*p += lws_snprintf((char *)(*p), lws_ptr_diff(end, p), "--%s\xd\xa"
				    "Content-Disposition: form-data; "
				      "name=\"%s\"",
				      wsi->http.multipart_boundary, name);
	if (filename)
		*p += lws_snprintf((char *)(*p), lws_ptr_diff(end, p),
				   "; filename=\"%s\"", filename);

	if (content_type)
		*p += lws_snprintf((char *)(*p), lws_ptr_diff(end, p), "\xd\xa"
				"Content-Type: %s", content_type);

	*p += lws_snprintf((char *)(*p), lws_ptr_diff(end, p), "\xd\xa\xd\xa");

	return *p == end;
}